

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnetworkaccesscache.cpp
# Opt level: O1

void __thiscall QNetworkAccessCache::updateTimer(QNetworkAccessCache *this)

{
  long lVar1;
  int iVar2;
  
  QBasicTimer::stop();
  if (*(long *)(this + 0x18) != 0) {
    lVar1 = QDeadlineTimer::remainingTime();
    iVar2 = 0;
    if (0 < lVar1) {
      iVar2 = (int)lVar1;
    }
    QBasicTimer::start(this + 0x28,(long)(iVar2 + 10) * 1000000,1,this);
    return;
  }
  return;
}

Assistant:

void QNetworkAccessCache::updateTimer()
{
    timer.stop();

    if (!firstExpiringNode)
        return;

    qint64 interval = firstExpiringNode->timer.remainingTime();
    if (interval <= 0) {
        interval = 0;
    }

    // Plus 10 msec so we don't spam timer events if date comparisons are too fuzzy.
    // This code used to do (broken) rounding, but for ConnectionCacheExpiryTimeoutSecondsAttribute
    // to work we cannot do this.
    // See discussion in https://codereview.qt-project.org/c/qt/qtbase/+/337464
    timer.start(interval + 10, this);
}